

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  pointer pcVar1;
  bool bVar2;
  pointer pbVar3;
  string filename;
  string srcFiles;
  string local_90;
  value_type local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pbVar3 = (srcs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 != (srcs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + pbVar3->_M_string_length);
      if ((*local_90._M_dataplus._M_p == '$') && (local_90._M_dataplus._M_p[1] == '<')) {
LAB_00399ada:
        std::__cxx11::string::append((char *)&local_70);
        bVar2 = true;
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
      }
      else {
        if (local_90._M_string_length == 0) {
LAB_00399ac9:
          cmMakefile::GetOrCreateSource(this->Makefile,&local_90,false);
          goto LAB_00399ada;
        }
        ProcessSourceItemCMP0049(&local_50,this,&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_90._M_string_length != 0) goto LAB_00399ac9;
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) goto LAB_00399b8a;
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (srcs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_70._M_string_length != 0) {
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&local_90,this->Makefile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&((this->Internal).Pointer)->SourceEntries,&local_70);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
              (&((this->Internal).Pointer)->SourceBacktraces,(value_type *)&local_90);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_90);
  }
LAB_00399b8a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = srcs.begin();
       i != srcs.end(); ++i) {
    std::string filename = *i;
    const char* src = filename.c_str();

    if (!(src[0] == '$' && src[1] == '<')) {
      if (!filename.empty()) {
        filename = this->ProcessSourceItemCMP0049(filename);
        if (filename.empty()) {
          return;
        }
      }
      this->Makefile->GetOrCreateSource(filename);
    }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
  }
  if (!srcFiles.empty()) {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(srcFiles);
    this->Internal->SourceBacktraces.push_back(lfbt);
  }
}